

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

int __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,void *buffer,int byteCount,int C1)

{
  RegSlot RVar1;
  RegSlot RVar2;
  uint local_40;
  int local_3c;
  OpLayoutReg2Aux data;
  int currentOffset;
  int byteCount_local;
  void *buffer_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.R1 = byteCount;
  CheckOpen(this);
  RVar1 = ConsumeReg(this,R0);
  RVar2 = ConsumeReg(this,R1);
  local_40 = InsertAuxiliaryData(this,buffer,data.R1);
  local_3c = C1;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar1;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 = RVar2;
  data.super_OpLayoutAuxiliary.R0 = local_40;
  Data::Encode(&this->m_byteCodeData,op,&local_40,0x10,this);
  return data.super_OpLayoutAuxiliary.R0;
}

Assistant:

int ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        int currentOffset   = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }